

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<capnp::compiler::BrandedDecl> *
kj::heapArray<capnp::compiler::BrandedDecl>(ArrayPtr<capnp::compiler::BrandedDecl> content)

{
  size_t in_RDX;
  Array<capnp::compiler::BrandedDecl> *result;
  Array<capnp::compiler::BrandedDecl> *in_RDI;
  ArrayBuilder<capnp::compiler::BrandedDecl> builder;
  ArrayBuilder<capnp::compiler::BrandedDecl> local_48;
  ArrayPtr<capnp::compiler::BrandedDecl> local_28;
  
  local_48.ptr = _::HeapArrayDisposer::allocateUninitialized<capnp::compiler::BrandedDecl>(in_RDX);
  local_48.endPtr = local_48.ptr + in_RDX;
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.pos = local_48.ptr;
  ArrayBuilder<capnp::compiler::BrandedDecl>::addAll<kj::ArrayPtr<capnp::compiler::BrandedDecl>&>
            (&local_48,&local_28);
  in_RDI->ptr = local_48.ptr;
  in_RDI->size_ = ((long)local_48.pos - (long)local_48.ptr) / 0xa8;
  in_RDI->disposer = local_48.disposer;
  local_48.ptr = (BrandedDecl *)0x0;
  local_48.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
  local_48.endPtr = (BrandedDecl *)0x0;
  ArrayBuilder<capnp::compiler::BrandedDecl>::dispose(&local_48);
  return in_RDI;
}

Assistant:

Array<T> heapArray(ArrayPtr<T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}